

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception-test.c++
# Opt level: O0

void __thiscall kj::_::anon_unknown_0::TestCase129::run(TestCase129 *this)

{
  bool bVar1;
  NullableValue<kj::Exception> *other;
  Exception *pEVar2;
  anon_class_1_0_00000001 *in_RDX;
  bool local_38a;
  bool local_389;
  undefined1 local_388 [6];
  bool _kj_shouldLog_1;
  bool _kj_shouldLog;
  ArrayPtr<const_char> local_378;
  bool local_362;
  DebugExpression<bool> local_361;
  Exception *pEStack_360;
  DebugExpression<bool> _kjCondition;
  Exception *e;
  kj local_341;
  Maybe<kj::Exception> local_340;
  undefined1 local_1a8 [8];
  NullableValue<kj::Exception> _e130;
  TestCase129 *this_local;
  
  _e130.field_1.value.details.builder.disposer = (ArrayDisposer *)this;
  runCatchingExceptions<kj::_::(anonymous_namespace)::TestCase129::run()::__0>
            (&local_340,&local_341,in_RDX);
  other = readMaybe<kj::Exception>(&local_340);
  NullableValue<kj::Exception>::NullableValue((NullableValue<kj::Exception> *)local_1a8,other);
  Maybe<kj::Exception>::~Maybe(&local_340);
  pEVar2 = _::NullableValue::operator_cast_to_Exception_((NullableValue *)local_1a8);
  if (pEVar2 == (Exception *)0x0) {
    local_38a = Debug::shouldLog(ERROR);
    while (local_38a != false) {
      Debug::log<char_const(&)[42]>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
                 ,0x82,ERROR,"\"code did not throw: \" \"new ExceptionCallback\"",
                 (char (*) [42])"code did not throw: new ExceptionCallback");
      local_38a = false;
    }
  }
  else {
    pEStack_360 = NullableValue<kj::Exception>::operator*((NullableValue<kj::Exception> *)local_1a8)
    ;
    local_378 = (ArrayPtr<const_char>)Exception::getDescription(pEStack_360);
    StringPtr::StringPtr((StringPtr *)local_388,"must be allocated on the stack");
    local_362 = StringPtr::contains((StringPtr *)&local_378,(StringPtr *)local_388);
    local_361 = DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&_::MAGIC_ASSERT,&local_362);
    bVar1 = _::DebugExpression::operator_cast_to_bool((DebugExpression *)&local_361);
    if (!bVar1) {
      local_389 = Debug::shouldLog(ERROR);
      while (local_389 != false) {
        Debug::log<char_const(&)[79],kj::_::DebugExpression<bool>&,char_const(&)[56],kj::Exception&>
                  ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/exception-test.c++"
                   ,0x82,ERROR,
                   "\"failed: expected \" \"e.getDescription().contains(\\\"must be allocated on the stack\\\")\", _kjCondition, \"exception description didn\'t contain expected substring\", e"
                   ,(char (*) [79])
                    "failed: expected e.getDescription().contains(\"must be allocated on the stack\")"
                   ,&local_361,
                   (char (*) [56])"exception description didn\'t contain expected substring",
                   pEStack_360);
        local_389 = false;
      }
    }
  }
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)local_1a8);
  return;
}

Assistant:

TEST(Exception, ExceptionCallbackMustBeOnStack) {
  KJ_EXPECT_THROW_MESSAGE("must be allocated on the stack", new ExceptionCallback);
}